

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_uint_t integer_log2(sexp_uint_t x)

{
  ulong in_RDI;
  sexp_uint_t tt;
  sexp_uint_t t;
  int local_28;
  int local_24;
  sexp_uint_t in_stack_ffffffffffffffe8;
  sexp_uint_t local_8;
  
  if (in_RDI >> 0x20 == 0) {
    if (in_RDI >> 0x10 == 0) {
      if (in_RDI >> 8 == 0) {
        local_28 = (int)""[in_RDI];
      }
      else {
        local_28 = ""[in_RDI >> 8] + 8;
      }
      local_8 = (sexp_uint_t)local_28;
    }
    else {
      if (in_RDI >> 0x18 == 0) {
        local_24 = ""[in_RDI >> 0x10] + 0x10;
      }
      else {
        local_24 = ""[in_RDI >> 0x18] + 0x18;
      }
      local_8 = (sexp_uint_t)local_24;
    }
  }
  else {
    local_8 = integer_log2(in_stack_ffffffffffffffe8);
    local_8 = local_8 + 0x20;
  }
  return local_8;
}

Assistant:

static sexp_uint_t integer_log2 (sexp_uint_t x) {
  sexp_uint_t t, tt;
#if SEXP_64_BIT
  if ((tt = x >> 32))
    return integer_log2(tt) + 32;
  else
#endif
  if ((tt = x >> 16))
    return (t = tt >> 8) ? 24 + log_table_256[t] : 16 + log_table_256[tt];
  else 
    return (t = x >> 8) ? 8 + log_table_256[t] : log_table_256[x];
}